

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredlines.cc
# Opt level: O3

void __thiscall gvr::ColoredLines::saveSTL(ColoredLines *this,char *name)

{
  IOException *this_00;
  string local_40;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Cannot store colored lines in STL format. STL is a triangle format.","");
  gutil::IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void ColoredLines::saveSTL(const char *name) const
{
  throw gutil::IOException("Cannot store colored lines in STL format. STL is a triangle format.");
}